

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
SMBusSimulationDataGenerator::OutputReadWord
          (SMBusSimulationDataGenerator *this,U8 command,U16 data_word)

{
  byte bVar1;
  U8 byte;
  bool is_ack;
  char cVar2;
  byte byte_00;
  
  OutputStart(this);
  OutputByte(this,0x86,true);
  OutputByte(this,command,true);
  bVar1 = ""[command ^ 0x9b];
  OutputStart(this);
  OutputByte(this,0x87,true);
  byte_00 = (byte)(data_word >> 8);
  OutputByte(this,byte_00,true);
  bVar1 = ""[(ulong)bVar1 ^ 0x87];
  is_ack = (bool)AnalyzerSettingInterfaceBool::GetValue();
  OutputByte(this,(byte)data_word,is_ack);
  byte = ""[(byte)((byte)data_word ^ ""[bVar1 ^ byte_00])];
  cVar2 = AnalyzerSettingInterfaceBool::GetValue();
  if (cVar2 != '\0') {
    OutputByte(this,byte,false);
  }
  OutputStop(this);
  ClockGenerator::AdvanceByTimeS(0.0005);
  SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x18);
  return;
}

Assistant:

void SMBusSimulationDataGenerator::OutputReadWord( U8 command, U16 data_word )
{
    U8 pec = 0;

    OutputStart();
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x43, false ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( command ) ];
    OutputStart();
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x43, true ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( U8( data_word >> 8 ) ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( U8( data_word & 0xff ), mSettings->CalcPEC() ) ];
    if( mSettings->CalcPEC() )
        OutputByte( pec, false );
    OutputStop();

    AdvanceAllBySec( ONE_MS * 0.5 );
}